

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall doctest::String::operator=(String *this,String *other)

{
  char *pcVar1;
  bool bVar2;
  String *in_RSI;
  String *in_RDI;
  
  if (in_RDI != in_RSI) {
    bVar2 = isOnStack(in_RDI);
    if ((!bVar2) && (pcVar1 = (in_RDI->field_0).data.ptr, pcVar1 != (char *)0x0)) {
      operator_delete__(pcVar1);
    }
    (in_RDI->field_0).data.ptr = (in_RSI->field_0).data.ptr;
    *(undefined8 *)((long)&in_RDI->field_0 + 8) = *(undefined8 *)((long)&in_RSI->field_0 + 8);
    *(undefined8 *)((long)&in_RDI->field_0 + 0x10) = *(undefined8 *)((long)&in_RSI->field_0 + 0x10);
    (in_RSI->field_0).buf[0] = '\0';
    setLast(in_RSI,0x17);
  }
  return in_RDI;
}

Assistant:

String& String::operator=(String&& other) {
    if(this != &other) {
        if(!isOnStack())
            delete[] data.ptr;
        memcpy(buf, other.buf, len);
        other.buf[0] = '\0';
        other.setLast();
    }
    return *this;
}